

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O1

void __thiscall
cppcms::sessions::session_file_storage_factory::session_file_storage_factory
          (session_file_storage_factory *this,string *path,int conc,int proc_no,bool force_lock)

{
  pointer pcVar1;
  session_file_storage *this_00;
  string local_50;
  
  (this->super_session_storage_factory)._vptr_session_storage_factory =
       (_func_int **)&PTR_get_0028e180;
  this_00 = (session_file_storage *)operator_new(0x60);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + path->_M_string_length);
  session_file_storage::session_file_storage(this_00,&local_50,conc,proc_no,force_lock);
  (this->storage_).
  super___shared_ptr<cppcms::sessions::session_file_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppcms::sessions::session_file_storage*>
            (&(this->storage_).
              super___shared_ptr<cppcms::sessions::session_file_storage,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

session_file_storage_factory::session_file_storage_factory(std::string path,int conc,int proc_no,bool force_lock) :
	storage_(new session_file_storage(path,conc,proc_no,force_lock))
{
}